

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::WrappingVisitor::internalVisit(WrappingVisitor *this,StuntDouble *sd)

{
  bool bVar1;
  SnapshotManager *this_00;
  Snapshot *v;
  StuntDouble *in_RDI;
  Vector3d newPos;
  Snapshot *currSnapshot;
  iterator i;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::AtomData> *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  shared_ptr<OpenMD::GenericData> *__r;
  iterator *in_stack_ffffffffffffff00;
  AtomData *in_stack_ffffffffffffff08;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Snapshot *in_stack_ffffffffffffff60;
  undefined1 local_79 [49];
  __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
  local_48;
  __shared_ptr local_40 [64];
  
  std::shared_ptr<OpenMD::GenericData>::shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34b4f1);
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34b4fe);
  std::shared_ptr<OpenMD::AtomInfo>::shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34b50b);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
  ::__normal_iterator(&local_48);
  __r = (shared_ptr<OpenMD::GenericData> *)local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  StuntDouble::getPropertyByName(in_RDI,in_stack_fffffffffffffee0);
  std::shared_ptr<OpenMD::GenericData>::operator=
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffee0,
             (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffed8);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34b590);
  std::__cxx11::string::~string((string *)(local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_79);
  bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffed8);
  if (bVar1) {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>(__r);
    std::shared_ptr<OpenMD::AtomData>::operator=
              ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34b5fb);
    bVar1 = std::operator==((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffee0,
                            in_stack_fffffffffffffed8);
    if (!bVar1) {
      this_00 = SimInfo::getSnapshotManager(*(SimInfo **)&in_RDI->globalIndex_);
      v = SnapshotManager::getCurrentSnapshot(this_00);
      std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x34b6b8);
      AtomData::beginAtomInfo(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      std::shared_ptr<OpenMD::AtomInfo>::operator=
                ((shared_ptr<OpenMD::AtomInfo> *)this_00,(shared_ptr<OpenMD::AtomInfo> *)v);
      std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34b6eb);
      while (bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40), bVar1) {
        std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x34b70e);
        OpenMD::operator-((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)this_00);
        Vector3<double>::Vector3((Vector3<double> *)this_00,(Vector<double,_3U> *)v);
        Snapshot::wrapVector
                  (in_stack_ffffffffffffff60,
                   (Vector3d *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x34b759);
        Vector3<double>::operator=((Vector3<double> *)this_00,(Vector3<double> *)v);
        std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x34b77b);
        AtomData::nextAtomInfo(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        std::shared_ptr<OpenMD::AtomInfo>::operator=
                  ((shared_ptr<OpenMD::AtomInfo> *)this_00,(shared_ptr<OpenMD::AtomInfo> *)v);
        std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34b7ae);
      }
    }
  }
  std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34b7e1);
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34b7ee);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34b7fb);
  return;
}

Assistant:

void WrappingVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;

    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) return;
    } else
      return;

    Snapshot* currSnapshot = info->getSnapshotManager()->getCurrentSnapshot();

    for (atomInfo = atomData->beginAtomInfo(i); atomInfo;
         atomInfo = atomData->nextAtomInfo(i)) {
      Vector3d newPos = atomInfo->pos - origin_;
      currSnapshot->wrapVector(newPos);
      atomInfo->pos = newPos;
    }
  }